

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O1

BigNumber * __thiscall
BigNumber::subtractstr(BigNumber *__return_storage_ptr__,BigNumber *this,string *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  BigNumber local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar2 = (other->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + other->_M_string_length);
  paVar1 = &local_68._numberString.field_2;
  local_68._numberString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_48,local_40 + (long)local_48);
  subtract(__return_storage_ptr__,this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._numberString._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._numberString._M_dataplus._M_p,
                    local_68._numberString.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::subtractstr(const std::string &other) {
    return this->subtract(BigNumber(other));
}